

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O2

char * cutToWhiteSpace(char *s,uint offset,char *sbuf)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar8;
  ulong uVar7;
  
  if (s == (char *)0x0) {
    *sbuf = '\0';
  }
  else {
    uVar2 = (ulong)offset;
    uVar8 = (ulong)offset;
    sVar4 = strlen(s);
    if (uVar8 < sVar4) {
      for (uVar5 = 0; uVar7 = uVar2, uVar8 != uVar5; uVar5 = uVar5 + 1) {
        if (s[uVar5] == '\n') {
          uVar3 = (uint)uVar5;
          if (offset != uVar3) {
            uVar8 = (ulong)(uVar3 + 1);
            goto LAB_001321e5;
          }
          break;
        }
      }
      do {
        uVar6 = (uint)uVar7;
        uVar3 = offset;
        if (uVar6 == 0) break;
        pcVar1 = s + uVar7;
        uVar7 = (ulong)(uVar6 - 1);
        uVar3 = uVar6;
      } while (*pcVar1 != ' ');
      uVar8 = (ulong)(uVar6 + 1);
      if (uVar6 == 0) {
        uVar8 = uVar2;
      }
LAB_001321e5:
      strncpy(sbuf,s,(ulong)uVar3);
      sbuf[uVar3] = '\0';
      return s + uVar8;
    }
    strcpy(sbuf,s);
    sbuf[uVar8] = '\0';
  }
  return (char *)0x0;
}

Assistant:

static const char *cutToWhiteSpace(const char *s, /**< starting point of desired string to output */
                                   uint offset,   /**< column width desired */
                                   char *sbuf     /**< the buffer to output */
                                   )
{
    if (!s)
    {
        sbuf[0] = '\0';
        return NULL;
    }
    else if (strlen(s) <= offset)
    {
        strcpy(sbuf,s);
        sbuf[offset] = '\0';
        return NULL;
    }
    else
    {
        uint j, l, n;
        /* scan forward looking for newline */
        j = 0;
        while(j < offset && s[j] != '\n')
            ++j;
        if ( j == offset ) {
            /* scan backward looking for first space */
            j = offset;
            while(j && s[j] != ' ')
                --j;
            l = j;
            n = j+1;
            /* no white space */
            if (j==0)
            {
                l = offset;
                n = offset;
            }
        } else
        {
            l = j;
            n = j+1;
        }
        strncpy(sbuf,s,l);
        sbuf[l] = '\0';
        return s+n;
    }
}